

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re_search.c
# Opt level: O3

int re_backsrch(void)

{
  mgwin *pmVar1;
  regoff_t rVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  line *plVar8;
  
  plVar8 = curwp->w_dotp;
  iVar5 = curwp->w_dotline;
  if (curwp->w_doto < 1) {
    plVar8 = plVar8->l_bp;
    iVar5 = iVar5 + -1;
    iVar6 = plVar8->l_used;
  }
  else {
    iVar6 = curwp->w_doto + -1;
  }
  if (plVar8 != curbp->b_headp) {
    iVar3 = plVar8->l_used;
    do {
      regex_match[0].rm_so = 0;
      pcVar7 = plVar8->l_text;
      if (pcVar7 == (char *)0x0) {
        pcVar7 = "";
      }
      regex_match[0].rm_eo = iVar3;
      iVar3 = regexec((regex_t *)&regex_buff,pcVar7,10,(regmatch_t *)regex_match,4);
      if ((iVar3 == 0) && (regex_match[0].rm_so <= iVar6)) {
        do {
          iVar3 = regex_match[0].rm_so;
          rVar2 = regex_match[0].rm_eo;
          regex_match[0].rm_so = iVar3 + 1;
          regex_match[0].rm_eo = plVar8->l_used;
          pcVar7 = plVar8->l_text;
          if (pcVar7 == (char *)0x0) {
            pcVar7 = "";
          }
          iVar4 = regexec((regex_t *)&regex_buff,pcVar7,10,(regmatch_t *)regex_match,4);
          pmVar1 = curwp;
        } while ((iVar4 == 0) && (regex_match[0].rm_so <= iVar6));
        if (iVar3 != -1) {
          regex_match[0].rm_so = iVar3;
          regex_match[0].rm_eo = rVar2;
          curwp->w_doto = iVar3;
          pmVar1->w_dotp = plVar8;
          pmVar1->w_dotline = iVar5;
          pmVar1->w_rflag = pmVar1->w_rflag | 2;
          return 1;
        }
      }
      plVar8 = plVar8->l_bp;
      iVar5 = iVar5 + -1;
      iVar6 = plVar8->l_used;
      iVar3 = iVar6;
    } while (plVar8 != curbp->b_headp);
  }
  return 0;
}

Assistant:

static int
re_backsrch(void)
{
	struct line		*clp;
	int		 tbo, tdotline;
	regmatch_t	 lastmatch;

	clp = curwp->w_dotp;
	tbo = curwp->w_doto;
	tdotline = curwp->w_dotline;

	/* Start search one position to the left of dot */
	tbo = tbo - 1;
	if (tbo < 0) {
		/* must move up one line */
		clp = lback(clp);
		tdotline--;
		tbo = llength(clp);
	}

	/*
	 * Note this loop does not process the last line, but this editor
	 * always makes the last line empty so this is good.
	 */
	while (clp != (curbp->b_headp)) {
		regex_match[0].rm_so = 0;
		regex_match[0].rm_eo = llength(clp);
		lastmatch.rm_so = -1;
		/*
		 * Keep searching until we don't match any longer.  Assumes a
		 * non-match does not modify the regex_match array.  We have to
		 * do this character-by-character after the first match since
		 * POSIX regexps don't give you a way to do reverse matches.
		 */
		while (!regexec(&regex_buff, ltext(clp) ? ltext(clp) : "",
		    RE_NMATCH, regex_match, REG_STARTEND) &&
		    regex_match[0].rm_so <= tbo) {
			memcpy(&lastmatch, &regex_match[0], sizeof(regmatch_t));
			regex_match[0].rm_so++;
			regex_match[0].rm_eo = llength(clp);
		}
		if (lastmatch.rm_so == -1) {
			clp = lback(clp);
			tdotline--;
			tbo = llength(clp);
		} else {
			memcpy(&regex_match[0], &lastmatch, sizeof(regmatch_t));
			curwp->w_doto = regex_match[0].rm_so;
			curwp->w_dotp = clp;
			curwp->w_dotline = tdotline;
			curwp->w_rflag |= WFMOVE;
			return (TRUE);
		}
	}
	return (FALSE);
}